

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O1

void __thiscall Lesson::print(Lesson *this)

{
  ostream *poVar1;
  char *pcVar2;
  pointer pPVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->exist == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"subject: ",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->subject)._M_dataplus._M_p,
                        (this->subject)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"room: ",6);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->room)._M_dataplus._M_p,
                        (this->room)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    pPVar3 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar3) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        Professor::print((Professor *)((long)&pPVar3->prep_id + lVar5),false);
        uVar4 = uVar4 + 1;
        pPVar3 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl
                 .super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0xb0;
      } while (uVar4 < (ulong)(((long)(this->prep_list).
                                      super__Vector_base<Professor,_std::allocator<Professor>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 4)
                              * 0x2e8ba2e8ba2e8ba3));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time: ",6);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->time)._M_dataplus._M_p,
                        (this->time)._M_string_length);
    pcVar2 = " ";
    lVar5 = 1;
  }
  else {
    poVar1 = (ostream *)&std::cout;
    pcVar2 = "none ";
    lVar5 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"exist: ",7);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void Lesson::print() {
    //std::cout  << "id: " << lesson_id << " ";
    if (exist) {
        std::cout  <<  "subject: "  << subject << " ";
        std::cout  << "room: " << room << " ";
        //std::cout  << "preps: " << professor << " ";

        for(size_t i = 0; i < prep_list.size(); i++) {

            prep_list[i].print();
        }
        std::cout << "time: " << time << " ";
        std::cout << "exist: " << exist << " ";
    }
    else {
        std::cout << "none " ;
        std::cout << "exist: " << exist << " ";
    }
    std::cout<<std::endl;



}